

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib670.c
# Opt level: O1

int test(char *URL)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  time_t tVar8;
  int *piVar9;
  long lVar10;
  int still_running;
  int maxfd;
  ReadThis pooh;
  timeval timeout;
  int msgs_left;
  fd_set fdwrite;
  fd_set fdexcept;
  int local_1f4;
  undefined8 local_1f0;
  int local_1e4;
  undefined8 local_1e0;
  long local_1d8;
  undefined4 local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1f4 = 0;
  iVar3 = curl_global_init(3);
  if (iVar3 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  local_1d8 = 0;
  local_1d0 = 0;
  local_1e0 = curl_easy_init();
  uVar6 = 0;
  iVar3 = curl_easy_setopt(local_1e0,0x2712,URL);
  if (iVar3 == 0) {
    uVar6 = 0;
    iVar3 = curl_easy_setopt(local_1e0,0x29,1);
    if (iVar3 == 0) {
      iVar3 = 0;
      iVar4 = curl_easy_setopt(local_1e0,0x2a,1);
      if (iVar4 == 0) {
        uVar6 = curl_mime_init(local_1e0);
        uVar7 = curl_mime_addpart(uVar6);
        iVar4 = curl_mime_name(uVar7,"field");
        if (iVar4 == 0) {
          iVar4 = curl_mime_data_cb(uVar7,2,read_callback,0,0,&local_1e0);
          if (iVar4 == 0) {
            iVar4 = 0;
            iVar3 = curl_easy_setopt(local_1e0,0x281d,uVar6);
            if (iVar3 != 0) goto LAB_00101376;
          }
          uVar7 = curl_multi_init();
          iVar5 = curl_multi_add_handle(uVar7,local_1e0);
          local_1f0 = uVar7;
          do {
            iVar3 = iVar4;
            if (iVar5 != 0) break;
            local_1e4 = -1;
            iVar5 = curl_multi_perform(uVar7,&local_1f4);
            bVar1 = true;
            if (iVar5 == 0 && local_1f4 != 0) {
              if (local_1d8 != 0) {
                tVar8 = time((time_t *)0x0);
                lVar10 = tVar8 - local_1d8;
                if (lVar10 < 8) {
                  bVar2 = false;
                  if (1 < lVar10) {
                    bVar2 = false;
                    curl_easy_pause(local_1e0,0);
                  }
                }
                else {
                  curl_mfprintf(_stderr,"unpausing failed: drain problem?\n");
                  bVar2 = true;
                  iVar4 = 0x1c;
                }
                if (7 < lVar10) {
                  iVar5 = 0;
                  uVar7 = local_1f0;
                  bVar1 = bVar2;
                  goto LAB_00101675;
                }
              }
              local_1b8.fds_bits[0xe] = 0;
              local_1b8.fds_bits[0xf] = 0;
              local_1b8.fds_bits[0xc] = 0;
              local_1b8.fds_bits[0xd] = 0;
              local_1b8.fds_bits[10] = 0;
              local_1b8.fds_bits[0xb] = 0;
              local_1b8.fds_bits[8] = 0;
              local_1b8.fds_bits[9] = 0;
              local_1b8.fds_bits[6] = 0;
              local_1b8.fds_bits[7] = 0;
              local_1b8.fds_bits[4] = 0;
              local_1b8.fds_bits[5] = 0;
              local_1b8.fds_bits[2] = 0;
              local_1b8.fds_bits[3] = 0;
              local_1b8.fds_bits[0] = 0;
              local_1b8.fds_bits[1] = 0;
              local_138.fds_bits[0] = 0;
              local_138.fds_bits[1] = 0;
              local_138.fds_bits[2] = 0;
              local_138.fds_bits[3] = 0;
              local_138.fds_bits[4] = 0;
              local_138.fds_bits[5] = 0;
              local_138.fds_bits[6] = 0;
              local_138.fds_bits[7] = 0;
              local_138.fds_bits[8] = 0;
              local_138.fds_bits[9] = 0;
              local_138.fds_bits[10] = 0;
              local_138.fds_bits[0xb] = 0;
              local_138.fds_bits[0xc] = 0;
              local_138.fds_bits[0xd] = 0;
              local_138.fds_bits[0xe] = 0;
              local_138.fds_bits[0xf] = 0;
              local_b8.fds_bits[0] = 0;
              local_b8.fds_bits[1] = 0;
              local_b8.fds_bits[2] = 0;
              local_b8.fds_bits[3] = 0;
              local_b8.fds_bits[4] = 0;
              local_b8.fds_bits[5] = 0;
              local_b8.fds_bits[6] = 0;
              local_b8.fds_bits[7] = 0;
              local_b8.fds_bits[8] = 0;
              local_b8.fds_bits[9] = 0;
              local_b8.fds_bits[10] = 0;
              local_b8.fds_bits[0xb] = 0;
              local_b8.fds_bits[0xc] = 0;
              local_b8.fds_bits[0xd] = 0;
              local_b8.fds_bits[0xe] = 0;
              local_b8.fds_bits[0xf] = 0;
              local_1c8.tv_sec = 0;
              local_1c8.tv_usec = 200000;
              iVar5 = curl_multi_fdset(local_1f0,&local_1b8,&local_138,&local_b8,&local_1e4);
              uVar7 = local_1f0;
              if (iVar5 == 0) {
                iVar3 = select(local_1e4 + 1,&local_1b8,&local_138,&local_b8,&local_1c8);
                if (iVar3 == -1) {
                  iVar5 = 0;
                  curl_mfprintf(_stderr,"Select error\n");
                  uVar7 = local_1f0;
                }
                else {
                  bVar1 = false;
                  iVar5 = 0;
                  uVar7 = local_1f0;
                }
              }
            }
LAB_00101675:
            iVar3 = iVar4;
          } while (!bVar1);
          if ((iVar5 != 0) &&
             (piVar9 = (int *)curl_multi_info_read(uVar7,&local_1b8), piVar9 != (int *)0x0)) {
            do {
              if (*piVar9 == 1) {
                iVar3 = piVar9[4];
              }
              piVar9 = (int *)curl_multi_info_read(uVar7,&local_1b8);
            } while (piVar9 != (int *)0x0);
          }
          curl_multi_remove_handle(uVar7,local_1e0);
          curl_multi_cleanup(uVar7);
        }
        else {
          curl_mfprintf(_stderr,"Something went wrong when building the mime structure: %d\n",iVar4)
          ;
        }
      }
      else {
        uVar6 = 0;
        iVar3 = iVar4;
      }
    }
  }
LAB_00101376:
  curl_easy_cleanup(local_1e0);
  curl_mime_free(uVar6);
  curl_global_cleanup();
  return iVar3;
}

Assistant:

int test(char *URL)
{
#if defined(LIB670) || defined(LIB671)
  curl_mime *mime = NULL;
  curl_mimepart *part;
#else
  CURLFORMcode formrc;
  struct curl_httppost *formpost = NULL;
  struct curl_httppost *lastptr = NULL;
#endif
#if defined(LIB670) || defined(LIB672)
  CURLM *multi = NULL;
  CURLMcode mres;
  CURLMsg *msg;
  int msgs_left;
  int still_running = 0;
#endif

  struct ReadThis pooh;
  CURLcode result;
  int res = TEST_ERR_FAILURE;

  /*
   * Check proper pausing/unpausing from a mime or form read callback.
   */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  pooh.origin = (time_t) 0;
  pooh.count = 0;
  pooh.easy = curl_easy_init();

  /* First set the URL that is about to receive our POST. */
  test_setopt(pooh.easy, CURLOPT_URL, URL);

  /* get verbose debug output please */
  test_setopt(pooh.easy, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(pooh.easy, CURLOPT_HEADER, 1L);

#if defined(LIB670) || defined(LIB671)
  /* Build the mime tree. */
  mime = curl_mime_init(pooh.easy);
  part = curl_mime_addpart(mime);
  result = curl_mime_name(part, name);
  if(!result)
    res = curl_mime_data_cb(part, (curl_off_t) 2, read_callback,
                            NULL, NULL, &pooh);

  if(result) {
    fprintf(stderr,
            "Something went wrong when building the mime structure: %d\n",
            (int) result);
    goto test_cleanup;
  }

  /* Bind mime data to its easy handle. */
  if(!res)
    test_setopt(pooh.easy, CURLOPT_MIMEPOST, mime);
#else
  /* Build the form. */
  formrc = curl_formadd(&formpost, &lastptr,
                        CURLFORM_COPYNAME, name,
                        CURLFORM_STREAM, &pooh,
                        CURLFORM_CONTENTLEN, (curl_off_t) 2,
                        CURLFORM_END);
  if(formrc) {
    fprintf(stderr, "curl_formadd() = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* We want to use our own read function. */
  test_setopt(pooh.easy, CURLOPT_READFUNCTION, read_callback);

  /* Send a multi-part formpost. */
  test_setopt(pooh.easy, CURLOPT_HTTPPOST, formpost);
#endif

#if defined(LIB670) || defined(LIB672)
  /* Use the multi interface. */
  multi = curl_multi_init();
  mres = curl_multi_add_handle(multi, pooh.easy);
  while(!mres) {
    struct timeval timeout;
    int rc = 0;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcept;
    int maxfd = -1;

    mres = curl_multi_perform(multi, &still_running);
    if(!still_running || mres != CURLM_OK)
      break;

    if(pooh.origin) {
      time_t delta = time(NULL) - pooh.origin;

      if(delta >= 4 * PAUSE_TIME) {
        fprintf(stderr, "unpausing failed: drain problem?\n");
        res = CURLE_OPERATION_TIMEDOUT;
        break;
      }

      if(delta >= PAUSE_TIME)
        curl_easy_pause(pooh.easy, CURLPAUSE_CONT);
    }

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcept);
    timeout.tv_sec = 0;
    timeout.tv_usec = 1000000 * PAUSE_TIME / 10;
    mres = curl_multi_fdset(multi, &fdread, &fdwrite, &fdexcept, &maxfd);
    if(mres)
      break;
#ifdef _WIN32
    if(maxfd == -1)
      Sleep(100);
    else
#endif
    rc = select(maxfd + 1, &fdread, &fdwrite, &fdexcept, &timeout);
    if(rc == -1) {
      fprintf(stderr, "Select error\n");
      break;
    }
  }

  if(mres != CURLM_OK)
    for(;;) {
      msg = curl_multi_info_read(multi, &msgs_left);
      if(!msg)
        break;
      if(msg->msg == CURLMSG_DONE) {
        result = msg->data.result;
        res = (int) result;
      }
    }

  curl_multi_remove_handle(multi, pooh.easy);
  curl_multi_cleanup(multi);

#else
  /* Use the easy interface. */
  test_setopt(pooh.easy, CURLOPT_XFERINFODATA, &pooh);
  test_setopt(pooh.easy, CURLOPT_XFERINFOFUNCTION, xferinfo);
  test_setopt(pooh.easy, CURLOPT_NOPROGRESS, 0L);
  result = curl_easy_perform(pooh.easy);
  res = (int) result;
#endif


test_cleanup:
  curl_easy_cleanup(pooh.easy);
#if defined(LIB670) || defined(LIB671)
  curl_mime_free(mime);
#else
  curl_formfree(formpost);
#endif

  curl_global_cleanup();
  return res;
}